

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

void ipc_ep_accept_cb(void *arg)

{
  nni_aio *aio;
  nni_aio *aio_00;
  nng_err result;
  nng_stream *conn;
  ipc_pipe *local_30;
  ipc_pipe *p;
  
  aio = (nni_aio *)((long)arg + 0x60);
  nni_mtx_lock((nni_mtx *)arg);
  result = nni_aio_result(aio);
  if (result == NNG_OK) {
    conn = (nng_stream *)nni_aio_get_output(aio,0);
    if (*(char *)((long)arg + 0x33) == '\x01') {
      nng_stream_free(conn);
      result = NNG_ECLOSED;
      goto LAB_0012c2e6;
    }
    result = nni_pipe_alloc_listener(&local_30,*(nni_listener **)((long)arg + 0x48));
    if (result != NNG_OK) {
      nng_stream_free(conn);
      goto LAB_0012c2e6;
    }
    ipc_pipe_start(local_30,conn,(ipc_ep *)arg);
LAB_0012c337:
    nng_stream_listener_accept(*(nng_stream_listener **)((long)arg + 0x40),aio);
  }
  else {
LAB_0012c2e6:
    aio_00 = *(nni_aio **)((long)arg + 0x58);
    if (aio_00 != (nni_aio *)0x0) {
      *(undefined8 *)((long)arg + 0x58) = 0;
      nni_aio_finish_error(aio_00,result);
    }
    if (result != NNG_ENOMEM) {
      if ((result == NNG_ECLOSED) || (result == NNG_ESTOPPED)) goto LAB_0012c343;
      if (result != NNG_ENOFILES) goto LAB_0012c337;
    }
    nng_sleep_aio(10,(nng_aio *)((long)arg + 0x228));
  }
LAB_0012c343:
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
ipc_ep_accept_cb(void *arg)
{
	ipc_ep     *ep  = arg;
	nni_aio    *aio = &ep->conn_aio;
	ipc_pipe   *p;
	int         rv;
	nng_stream *conn;

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		rv = NNG_ECLOSED;
		nng_stream_free(conn);
		goto error;
	}
	rv = nni_pipe_alloc_listener((void **) &p, ep->nlistener);
	if (rv != 0) {
		nng_stream_free(conn);
		goto error;
	}

	ipc_pipe_start(p, conn, ep);

	nng_stream_listener_accept(ep->listener, &ep->conn_aio);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// When an error here occurs, let's send a notice up to the consumer.
	// That way it can be reported properly.
	if ((aio = ep->user_aio) != NULL) {
		ep->user_aio = NULL;
		nni_aio_finish_error(aio, rv);
	}

	switch (rv) {
	case NNG_ECLOSED:
	case NNG_ESTOPPED:
		break;
	case NNG_ENOMEM:
	case NNG_ENOFILES:
		nng_sleep_aio(10, &ep->time_aio);
		break;

	default:
		nng_stream_listener_accept(ep->listener, &ep->conn_aio);
		break;
	}
	nni_mtx_unlock(&ep->mtx);
}